

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

uint __thiscall llvm::AArch64::getDefaultFPU(AArch64 *this,StringRef CPU,ArchKind AK)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  switch(CPU.Data) {
  case (char *)0x4:
    if (*(int *)this == 0x6f79726b) {
      return 0x14;
    }
    break;
  case (char *)0x6:
    if (*(short *)(this + 4) == 0x726f && *(int *)this == 0x6b6c6166) {
      return 0x14;
    }
    break;
  case (char *)0x7:
    if (*(int *)(this + 3) == 0x63697265 && *(int *)this == 0x656e6567) {
      return *(uint *)(&DAT_00253630 + (CPU.Length & 0xffffffff) * 0x40);
    }
    if (*(int *)(this + 3) == 0x656e6f6c && *(int *)this == 0x6c637963) {
      return 0x14;
    }
    uVar1 = 0x14;
    if (*(int *)(this + 3) != 0x61726968 || *(int *)this != 0x68706173) {
      uVar1 = 0;
    }
    return uVar1;
  case (char *)0x8:
    if (*(long *)this == 0x787265646e756874) {
      return 0x14;
    }
    break;
  case (char *)0x9:
    if (this[8] == (AArch64)0x31 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x14;
    }
    if (this[8] == (AArch64)0x32 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x14;
    }
    if (this[8] == (AArch64)0x33 && *(long *)this == 0x6d2d736f6e797865) {
      return 0x14;
    }
    uVar2 = *(ulong *)this ^ 0x6d2d736f6e797865;
    uVar3 = (ulong)(byte)this[8] ^ 0x34;
    goto LAB_001c7b7e;
  case (char *)0xa:
    if (*(short *)(this + 8) == 0x3533 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3335 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3535 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3735 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3237 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    if (*(short *)(this + 8) == 0x3337 && *(long *)this == 0x612d786574726f63) {
      return 0x14;
    }
    uVar2 = *(ulong *)this ^ 0x612d786574726f63;
    uVar3 = (ulong)*(ushort *)(this + 8) ^ 0x3537;
    goto LAB_001c7b7e;
  case (char *)0xb:
    if (*(long *)(this + 3) == 0x383874787265646e && *(long *)this == 0x787265646e756874) {
      return 0x14;
    }
    if (*(long *)(this + 3) == 0x313874787265646e && *(long *)this == 0x787265646e756874) {
      return 0x14;
    }
    uVar2 = *(ulong *)this ^ 0x787265646e756874;
    uVar3 = *(ulong *)(this + 3) ^ 0x333874787265646e;
LAB_001c7b7e:
    if (uVar3 == 0 && uVar2 == 0) {
      return 0x14;
    }
    break;
  case (char *)0xc:
    if (*(int *)(this + 8) == 0x39397432 && *(long *)this == 0x787265646e756874) {
      return 0x14;
    }
  }
  return 0;
}

Assistant:

bool equals(StringRef RHS) const {
      return (Length == RHS.Length &&
              compareMemory(Data, RHS.Data, RHS.Length) == 0);
    }